

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

string * soul::padded(string *__return_storage_ptr__,string *s,int minSize)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_t num;
  int *piVar1;
  string local_48;
  int local_28 [3];
  int local_1c;
  int extraNeeded;
  int minSize_local;
  string *s_local;
  
  local_28[1] = 1;
  local_1c = minSize;
  _extraNeeded = s;
  s_local = __return_storage_ptr__;
  num = std::__cxx11::string::length();
  local_28[0] = minSize - (int)num;
  piVar1 = std::max<int>(local_28 + 1,local_28);
  __lhs = _extraNeeded;
  local_28[2] = *piVar1;
  repeatedCharacter_abi_cxx11_(&local_48,(soul *)0x20,(char)local_28[2],num);
  std::operator+(__return_storage_ptr__,__lhs,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string padded (const std::string& s, int minSize)
{
    auto extraNeeded = std::max (1, minSize - (int) s.length());
    return s + repeatedCharacter (' ', (size_t) extraNeeded);
}